

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KModule.c
# Opt level: O3

cs_err M68K_global_init(cs_struct *ud)

{
  void *pvVar1;
  
  pvVar1 = (*cs_mem_malloc)(0x180);
  if (pvVar1 != (void *)0x0) {
    ud->printer = M68K_printInst;
    ud->printer_info = pvVar1;
    ud->getinsn_info = (void *)0x0;
    ud->disasm = M68K_getInstruction;
    ud->skipdata_size = '\x02';
    ud->post_printer = (PostPrinter_t)0x0;
    ud->reg_name = M68K_reg_name;
    ud->insn_id = M68K_get_insn_id;
    ud->insn_name = M68K_insn_name;
    ud->group_name = M68K_group_name;
  }
  return (uint)(pvVar1 == (void *)0x0);
}

Assistant:

cs_err M68K_global_init(cs_struct *ud)
{
	m68k_info *info;

	info = cs_mem_malloc(sizeof(m68k_info));
	if (!info) {
		return CS_ERR_MEM;
	}

	ud->printer = M68K_printInst;
	ud->printer_info = info;
	ud->getinsn_info = NULL;
	ud->disasm = M68K_getInstruction;
	ud->skipdata_size = 2;
	ud->post_printer = NULL;

	ud->reg_name = M68K_reg_name;
	ud->insn_id = M68K_get_insn_id;
	ud->insn_name = M68K_insn_name;
	ud->group_name = M68K_group_name;

	return CS_ERR_OK;
}